

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINErrHandler(int error_code,char *module,char *function,char *msg,void *data)

{
  char local_42 [8];
  char err_type [10];
  KINMem kin_mem;
  void *data_local;
  char *msg_local;
  char *function_local;
  char *module_local;
  int error_code_local;
  
  err_type._2_8_ = data;
  if (error_code == 99) {
    sprintf(local_42,"WARNING");
  }
  else {
    sprintf(local_42,"ERROR");
  }
  if (*(long *)(err_type._2_8_ + 0x260) != 0) {
    fprintf(*(FILE **)(err_type._2_8_ + 0x260),"\n[%s %s]  %s\n",module,local_42,function);
    fprintf(*(FILE **)(err_type._2_8_ + 0x260),"  %s\n\n",msg);
  }
  return;
}

Assistant:

void KINErrHandler(int error_code, const char *module,
                   const char *function, char *msg, void *data)
{
  KINMem kin_mem;
  char err_type[10];

  /* data points to kin_mem here */

  kin_mem = (KINMem) data;

  if (error_code == KIN_WARNING)
    sprintf(err_type,"WARNING");
  else
    sprintf(err_type,"ERROR");

#ifndef NO_FPRINTF_OUTPUT
  if (kin_mem->kin_errfp != NULL) {
    fprintf(kin_mem->kin_errfp,"\n[%s %s]  %s\n",module,err_type,function);
    fprintf(kin_mem->kin_errfp,"  %s\n\n",msg);
  }
#endif

  return;
}